

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O3

void update_tremor(IT_CHANNEL *channel)

{
  uchar uVar1;
  byte bVar2;
  
  uVar1 = channel->tremor_time;
  if (((char)uVar1 < '\0') && (channel->playing != (IT_PLAYING *)0x0)) {
    if (uVar1 == 0xc0) {
      bVar2 = channel->lastI & 0xf | 0x80;
    }
    else if (uVar1 == 0x80) {
      bVar2 = channel->lastI >> 4 | 0xc0;
    }
    else {
      bVar2 = uVar1 - 1;
    }
    channel->tremor_time = bVar2;
    return;
  }
  return;
}

Assistant:

static void update_tremor(IT_CHANNEL *channel)
{
	if ((channel->tremor_time & 128) && channel->playing) {
		if (channel->tremor_time == 128)
			channel->tremor_time = (channel->lastI >> 4) | 192;
		else if (channel->tremor_time == 192)
			channel->tremor_time = (channel->lastI & 15) | 128;
		else
			channel->tremor_time--;
	}
}